

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int handle_stop_sending_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  uint8_t *end;
  int iVar1;
  uint64_t stream_id;
  uint64_t uVar2;
  uint err;
  quicly_stream_t *stream;
  quicly_stream_t *local_30;
  
  end = state->end;
  stream_id = ptls_decode_quicint(&state->src,end);
  iVar1 = 0x20007;
  if (((stream_id != 0xffffffffffffffff) &&
      (uVar2 = ptls_decode_quicint(&state->src,end), uVar2 != 0xffffffffffffffff)) &&
     (iVar1 = quicly_get_or_open_stream(conn,stream_id,&local_30),
     local_30 != (quicly_stream_t *)0x0 && iVar1 == 0)) {
    if ((local_30->sendstate).final_size == 0xffffffffffffffff) {
      err = (uint)uVar2 & 0xffff | 0x30000;
      quicly_reset_stream(local_30,err);
      (*local_30->callbacks->on_send_stop)(local_30,err);
      if (QUICLY_STATE_CONNECTED < (local_30->conn->super).state) {
        return 0xff06;
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int handle_stop_sending_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_stop_sending_frame_t frame;
    quicly_stream_t *stream;
    int ret;

    if ((ret = quicly_decode_stop_sending_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    if ((ret = quicly_get_or_open_stream(conn, frame.stream_id, &stream)) != 0 || stream == NULL)
        return ret;

    if (quicly_sendstate_is_open(&stream->sendstate)) {
        /* reset the stream, then notify the application */
        int err = QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(frame.app_error_code);
        quicly_reset_stream(stream, err);
        QUICLY_PROBE(STREAM_ON_SEND_STOP, stream->conn, stream->conn->stash.now, stream, err);
        stream->callbacks->on_send_stop(stream, err);
        if (stream->conn->super.state >= QUICLY_STATE_CLOSING)
            return QUICLY_ERROR_IS_CLOSING;
    }

    return 0;
}